

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int unicodeCreate(int nArg,char **azArg,sqlite3_tokenizer **pp)

{
  char *__s;
  int iVar1;
  int iVar2;
  size_t sVar3;
  int n;
  char *z;
  int rc;
  int i;
  unicode_tokenizer *pNew;
  sqlite3_tokenizer **pp_local;
  char **azArg_local;
  int nArg_local;
  
  z._0_4_ = 0;
  _rc = (unicode_tokenizer *)sqlite3_malloc(0x18);
  if (_rc == (unicode_tokenizer *)0x0) {
    azArg_local._4_4_ = 7;
  }
  else {
    memset(_rc,0,0x18);
    _rc->eRemoveDiacritic = 1;
    for (z._4_4_ = 0; (int)z == 0 && z._4_4_ < nArg; z._4_4_ = z._4_4_ + 1) {
      __s = azArg[z._4_4_];
      sVar3 = strlen(__s);
      iVar1 = (int)sVar3;
      if ((iVar1 == 0x13) && (iVar2 = memcmp("remove_diacritics=1",__s,0x13), iVar2 == 0)) {
        _rc->eRemoveDiacritic = 1;
      }
      else if ((iVar1 == 0x13) && (iVar2 = memcmp("remove_diacritics=0",__s,0x13), iVar2 == 0)) {
        _rc->eRemoveDiacritic = 0;
      }
      else if ((iVar1 == 0x13) && (iVar2 = memcmp("remove_diacritics=2",__s,0x13), iVar2 == 0)) {
        _rc->eRemoveDiacritic = 2;
      }
      else if ((iVar1 < 0xb) || (iVar2 = memcmp("tokenchars=",__s,0xb), iVar2 != 0)) {
        if ((iVar1 < 0xb) || (iVar2 = memcmp("separators=",__s,0xb), iVar2 != 0)) {
          z._0_4_ = 1;
        }
        else {
          z._0_4_ = unicodeAddExceptions(_rc,0,__s + 0xb,iVar1 + -0xb);
        }
      }
      else {
        z._0_4_ = unicodeAddExceptions(_rc,1,__s + 0xb,iVar1 + -0xb);
      }
    }
    if ((int)z != 0) {
      unicodeDestroy((sqlite3_tokenizer *)_rc);
      _rc = (unicode_tokenizer *)0x0;
    }
    *pp = &_rc->base;
    azArg_local._4_4_ = (int)z;
  }
  return azArg_local._4_4_;
}

Assistant:

static int unicodeCreate(
  int nArg,                       /* Size of array argv[] */
  const char * const *azArg,      /* Tokenizer creation arguments */
  sqlite3_tokenizer **pp          /* OUT: New tokenizer handle */
){
  unicode_tokenizer *pNew;        /* New tokenizer object */
  int i;
  int rc = SQLITE_OK;

  pNew = (unicode_tokenizer *) sqlite3_malloc(sizeof(unicode_tokenizer));
  if( pNew==NULL ) return SQLITE_NOMEM;
  memset(pNew, 0, sizeof(unicode_tokenizer));
  pNew->eRemoveDiacritic = 1;

  for(i=0; rc==SQLITE_OK && i<nArg; i++){
    const char *z = azArg[i];
    int n = (int)strlen(z);

    if( n==19 && memcmp("remove_diacritics=1", z, 19)==0 ){
      pNew->eRemoveDiacritic = 1;
    }
    else if( n==19 && memcmp("remove_diacritics=0", z, 19)==0 ){
      pNew->eRemoveDiacritic = 0;
    }
    else if( n==19 && memcmp("remove_diacritics=2", z, 19)==0 ){
      pNew->eRemoveDiacritic = 2;
    }
    else if( n>=11 && memcmp("tokenchars=", z, 11)==0 ){
      rc = unicodeAddExceptions(pNew, 1, &z[11], n-11);
    }
    else if( n>=11 && memcmp("separators=", z, 11)==0 ){
      rc = unicodeAddExceptions(pNew, 0, &z[11], n-11);
    }
    else{
      /* Unrecognized argument */
      rc  = SQLITE_ERROR;
    }
  }

  if( rc!=SQLITE_OK ){
    unicodeDestroy((sqlite3_tokenizer *)pNew);
    pNew = 0;
  }
  *pp = (sqlite3_tokenizer *)pNew;
  return rc;
}